

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAdaptiveRhoInterval_Test::TestBody
          (OsqpTest_GetAdaptiveRhoInterval_Test *this)

{
  pointer *__ptr_1;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *paVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  bool bVar3;
  StatusOr<long_long> adaptive_rho_interval;
  OsqpSolver solver;
  OsqpSettings settings;
  AssertHelper local_1a8;
  AssertHelper local_1a0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_198;
  anon_union_8_1_1246618d_for_StatusOrData<long_long>_1 local_190;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [8];
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  StorageIndex *local_150;
  CompressedStorage<double,_long_long> local_148;
  void *local_128;
  Scalar *local_100;
  StorageIndex *local_f8;
  CompressedStorage<double,_long_long> local_f0;
  double *local_d0;
  void *local_c0;
  OsqpSettings local_b0;
  
  OsqpSettings::OsqpSettings(&local_b0);
  local_b0.adaptive_rho_interval = 0xc;
  local_180._0_8_ =
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)0x0;
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_1a0,(OsqpInstance *)local_180,(OsqpSettings *)local_170);
  local_190.status_.rep_._0_1_ =
       (StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) == (StatusRep *)0x1;
  local_188.data_ = 0;
  if (((uint)local_1a0.data_ & 1) == 0) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_));
  }
  paVar1 = &local_188;
  free(local_c0);
  free(local_d0);
  free(local_100);
  free(local_f8);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_f0);
  free(local_128);
  free((void *)local_160._8_8_);
  free(local_150);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_148);
  if (local_190.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_190.status_,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x253,(char *)CONCAT71(local_170._1_7_,local_170[0]));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]) != local_170 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]),
                      local_160._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
    }
    local_168 = local_188;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00125113;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188.data_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)paVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    }
    local_190.status_.rep_._0_4_ = OsqpSolver::Solve((OsqpSolver *)local_180);
    local_1a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_170,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_190,(OsqpExitCode *)&local_1a0);
    if (local_170[0] != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_170 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
        ;
      }
      OsqpSolver::GetAdaptiveRhoInterval((OsqpSolver *)&local_190.status_);
      bVar3 = CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) == 1;
      local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,bVar3);
      local_198.data_ = 0;
      if (bVar3) {
        local_1a0.data_._0_4_ = 0xc;
        testing::internal::CmpHelperEQ<long_long,int>
                  ((internal *)local_170,"*adaptive_rho_interval","12",&local_188.data_,
                   (int *)&local_1a0);
        if (local_170[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_168;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,600,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *)(local_170 + 8);
LAB_00125104:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)paVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168);
        }
      }
      else {
        testing::Message::Message((Message *)&local_1a8);
        paVar1 = &local_198;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_1a0,
                   (AssertionResult *)"adaptive_rho_interval.ok()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_180 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,599,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_180 + 8),(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_180 + 8));
        if ((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]) != local_170 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_170._1_7_,local_170[0]),
                          local_160._M_allocated_capacity + 1);
        }
        if (local_1a8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_1a8.data_ + 8))();
        }
        local_168 = local_198;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198.data_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_00125104;
      }
      absl::internal_statusor::StatusOrData<long_long>::~StatusOrData
                ((StatusOrData<long_long> *)&local_190.status_);
      goto LAB_00125113;
    }
    testing::Message::Message((Message *)&local_190.status_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x254,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190.status_);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) + 8)
      )();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168.data_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00125113;
    paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *)(local_170 + 8);
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)paVar1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
LAB_00125113:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)local_180);
  return;
}

Assistant:

TEST(OsqpTest, GetAdaptiveRhoInterval) {
  OsqpSettings settings;
  settings.adaptive_rho_interval = 12;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  const auto adaptive_rho_interval = solver.GetAdaptiveRhoInterval();
  ASSERT_TRUE(adaptive_rho_interval.ok());
  EXPECT_EQ(*adaptive_rho_interval, 12);
}